

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFontGlyph * __thiscall ImFont::FindGlyph(ImFont *this,ImWchar c)

{
  ushort uVar1;
  undefined2 in_register_00000032;
  
  if (((ulong)CONCAT22(in_register_00000032,c) < (ulong)(long)(this->IndexLookup).Size) &&
     (uVar1 = (this->IndexLookup).Data[CONCAT22(in_register_00000032,c)], uVar1 != 0xffff)) {
    return (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  return this->FallbackGlyph;
}

Assistant:

const ImFontGlyph* ImFont::FindGlyph(ImWchar c) const
{
    if (c >= (size_t)IndexLookup.Size)
        return FallbackGlyph;
    const ImWchar i = IndexLookup.Data[c];
    if (i == (ImWchar)-1)
        return FallbackGlyph;
    return &Glyphs.Data[i];
}